

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<boost::unit_test::test_unit_fixture>::
shared_ptr<boost::unit_test::framework::impl::global_fixture_handle>
          (shared_ptr<boost::unit_test::test_unit_fixture> *this,global_fixture_handle *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  global_fixture_handle *p_00;
  shared_ptr<boost::unit_test::test_unit_fixture> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (global_fixture_handle *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::
  sp_pointer_construct<boost::unit_test::test_unit_fixture,boost::unit_test::framework::impl::global_fixture_handle>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }